

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_helper_out_func(TCGContext *tcg_ctx,MemOp ot,TCGv_i32 v,TCGv_i32 n)

{
  TCGv_i32 n_local;
  TCGv_i32 v_local;
  MemOp ot_local;
  TCGContext *tcg_ctx_local;
  
  if (ot == MO_8) {
    gen_helper_outb(tcg_ctx,tcg_ctx->cpu_env,v,n);
  }
  else if (ot == MO_16) {
    gen_helper_outw(tcg_ctx,tcg_ctx->cpu_env,v,n);
  }
  else {
    if (ot != MO_32) {
      fprintf(_stderr,"%s:%d: tcg fatal error\n",
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/translate.c"
              ,0x2eb);
      abort();
    }
    gen_helper_outl(tcg_ctx,tcg_ctx->cpu_env,v,n);
  }
  return;
}

Assistant:

static void gen_helper_out_func(TCGContext *tcg_ctx, MemOp ot, TCGv_i32 v, TCGv_i32 n)
{
    switch (ot) {
    case MO_8:
        gen_helper_outb(tcg_ctx, tcg_ctx->cpu_env, v, n);
        break;
    case MO_16:
        gen_helper_outw(tcg_ctx, tcg_ctx->cpu_env, v, n);
        break;
    case MO_32:
        gen_helper_outl(tcg_ctx, tcg_ctx->cpu_env, v, n);
        break;
    default:
        tcg_abort();
    }
}